

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

Instruction * __thiscall spvtools::opt::Pass::GetBaseType(Pass *this,uint32_t ty_id)

{
  uint32_t uVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  Op OVar4;
  
  pDVar2 = get_def_use_mgr(this);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,ty_id);
  OVar4 = pIVar3->opcode_;
  if (OVar4 == OpTypeMatrix) {
    uVar1 = Instruction::GetSingleWordInOperand(pIVar3,0);
    pDVar2 = get_def_use_mgr(this);
    pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
    OVar4 = pIVar3->opcode_;
  }
  if (OVar4 == OpTypeVector) {
    uVar1 = Instruction::GetSingleWordInOperand(pIVar3,0);
    pDVar2 = get_def_use_mgr(this);
    pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
    return pIVar3;
  }
  return pIVar3;
}

Assistant:

Instruction* Pass::GetBaseType(uint32_t ty_id) {
  Instruction* ty_inst = get_def_use_mgr()->GetDef(ty_id);
  if (ty_inst->opcode() == spv::Op::OpTypeMatrix) {
    uint32_t vty_id = ty_inst->GetSingleWordInOperand(0);
    ty_inst = get_def_use_mgr()->GetDef(vty_id);
  }
  if (ty_inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t cty_id = ty_inst->GetSingleWordInOperand(0);
    ty_inst = get_def_use_mgr()->GetDef(cty_id);
  }
  return ty_inst;
}